

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.cpp
# Opt level: O0

void pbrt::PiecewiseConstant2D::TestCompareDistributions
               (PiecewiseConstant2D *da,PiecewiseConstant2D *db,Float eps)

{
  bool bVar1;
  size_t sVar2;
  long in_RSI;
  long in_RDI;
  size_t i;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  PiecewiseConstant1D *in_stack_000000c8;
  PiecewiseConstant1D *in_stack_000000d0;
  Bounds2<float> *in_stack_ffffffffffffff40;
  size_type sVar3;
  Bounds2<float> *in_stack_ffffffffffffff48;
  char *in_stack_ffffffffffffff50;
  AssertionResult *pAVar4;
  undefined4 in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff5c;
  int line;
  char *in_stack_ffffffffffffff60;
  Type type;
  undefined7 in_stack_ffffffffffffff70;
  undefined1 uVar5;
  size_type local_88;
  AssertionResult local_70;
  uint local_5c;
  Message *in_stack_ffffffffffffffb8;
  AssertHelper *in_stack_ffffffffffffffc0;
  AssertionResult local_28;
  long local_10;
  long local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  PiecewiseConstant1D::TestCompareDistributions(in_stack_000000d0,in_stack_000000c8,da._4_4_);
  pstd::
  vector<pbrt::PiecewiseConstant1D,_pstd::pmr::polymorphic_allocator<pbrt::PiecewiseConstant1D>_>::
  size((vector<pbrt::PiecewiseConstant1D,_pstd::pmr::polymorphic_allocator<pbrt::PiecewiseConstant1D>_>
        *)(local_8 + 0x10));
  pstd::
  vector<pbrt::PiecewiseConstant1D,_pstd::pmr::polymorphic_allocator<pbrt::PiecewiseConstant1D>_>::
  size((vector<pbrt::PiecewiseConstant1D,_pstd::pmr::polymorphic_allocator<pbrt::PiecewiseConstant1D>_>
        *)(local_10 + 0x10));
  pAVar4 = &local_28;
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            ((char *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
             in_stack_ffffffffffffff50,(unsigned_long *)in_stack_ffffffffffffff48,
             (unsigned_long *)in_stack_ffffffffffffff40);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(pAVar4);
  type = (Type)((ulong)pAVar4 >> 0x20);
  uVar5 = bVar1;
  if (!bVar1) {
    testing::Message::Message((Message *)CONCAT17(bVar1,in_stack_ffffffffffffff70));
    in_stack_ffffffffffffff60 =
         testing::AssertionResult::failure_message((AssertionResult *)0x5d37b9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(uVar5,in_stack_ffffffffffffff70),type,
               in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c,in_stack_ffffffffffffff50);
    testing::internal::AssertHelper::operator=(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffff40);
    testing::Message::~Message((Message *)0x5d3807);
  }
  local_5c = (uint)!bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x5d3866);
  if (local_5c == 0) {
    pAVar4 = &local_70;
    testing::internal::EqHelper<false>::Compare<pbrt::Bounds2<float>,pbrt::Bounds2<float>>
              ((char *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
               &pAVar4->success_,in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(pAVar4);
    line = CONCAT13(bVar1,(int3)in_stack_ffffffffffffff5c);
    if (!bVar1) {
      testing::Message::Message((Message *)CONCAT17(uVar5,in_stack_ffffffffffffff70));
      testing::AssertionResult::failure_message((AssertionResult *)0x5d3902);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)CONCAT17(uVar5,in_stack_ffffffffffffff70),type,
                 in_stack_ffffffffffffff60,line,&pAVar4->success_);
      testing::internal::AssertHelper::operator=
                (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffff40);
      testing::Message::~Message((Message *)0x5d3950);
    }
    local_5c = (uint)!bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x5d39af);
    if (local_5c == 0) {
      local_88 = 0;
      while (sVar3 = local_88,
            sVar2 = pstd::
                    vector<pbrt::PiecewiseConstant1D,_pstd::pmr::polymorphic_allocator<pbrt::PiecewiseConstant1D>_>
                    ::size((vector<pbrt::PiecewiseConstant1D,_pstd::pmr::polymorphic_allocator<pbrt::PiecewiseConstant1D>_>
                            *)(local_8 + 0x10)), sVar3 < sVar2) {
        pstd::
        vector<pbrt::PiecewiseConstant1D,_pstd::pmr::polymorphic_allocator<pbrt::PiecewiseConstant1D>_>
        ::operator[]((vector<pbrt::PiecewiseConstant1D,_pstd::pmr::polymorphic_allocator<pbrt::PiecewiseConstant1D>_>
                      *)(local_8 + 0x10),local_88);
        pstd::
        vector<pbrt::PiecewiseConstant1D,_pstd::pmr::polymorphic_allocator<pbrt::PiecewiseConstant1D>_>
        ::operator[]((vector<pbrt::PiecewiseConstant1D,_pstd::pmr::polymorphic_allocator<pbrt::PiecewiseConstant1D>_>
                      *)(local_10 + 0x10),local_88);
        PiecewiseConstant1D::TestCompareDistributions(in_stack_000000d0,in_stack_000000c8,da._4_4_);
        local_88 = local_88 + 1;
      }
    }
  }
  return;
}

Assistant:

void PiecewiseConstant2D::TestCompareDistributions(const PiecewiseConstant2D &da,
                                                   const PiecewiseConstant2D &db,
                                                   Float eps) {
    PiecewiseConstant1D::TestCompareDistributions(da.pMarginal, db.pMarginal, eps);

    ASSERT_EQ(da.pConditionalY.size(), db.pConditionalY.size());
    ASSERT_EQ(da.domain, db.domain);
    for (size_t i = 0; i < da.pConditionalY.size(); ++i)
        PiecewiseConstant1D::TestCompareDistributions(da.pConditionalY[i],
                                                      db.pConditionalY[i], eps);
}